

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPathLabel.cxx
# Opt level: O3

void __thiscall cmPathLabel::cmPathLabel(cmPathLabel *this,string *label)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  uint uVar4;
  
  (this->Label)._M_dataplus._M_p = (pointer)&(this->Label).field_2;
  pcVar1 = (label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + label->_M_string_length);
  this->Hash = 0;
  sVar2 = (this->Label)._M_string_length;
  if (sVar2 == 0) {
    uVar4 = 0;
  }
  else {
    pcVar1 = (this->Label)._M_dataplus._M_p;
    sVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = ((int)pcVar1[sVar3] + uVar4) * 0x401;
      uVar4 = uVar4 >> 6 ^ uVar4;
      this->Hash = uVar4;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
    uVar4 = uVar4 * 9;
  }
  this->Hash = (uVar4 >> 0xb ^ uVar4) * 0x8001;
  return;
}

Assistant:

cmPathLabel::cmPathLabel(const std::string& label)
: Label(label), Hash(0)
{
  // Use a Jenkins one-at-a-time hash with under/over-flow protection
  for(size_t i = 0; i < this->Label.size(); ++i)
    {
    this->Hash += this->Label[i];
    this->Hash += ((this->Hash & 0x003FFFFF) << 10);
    this->Hash ^= ((this->Hash & 0xFFFFFFC0) >> 6);
    }
  this->Hash += ((this->Hash & 0x1FFFFFFF) << 3);
  this->Hash ^= ((this->Hash & 0xFFFFF800) >> 11);
  this->Hash += ((this->Hash & 0x0001FFFF) << 15);
}